

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::initQuadsIndices(COpenGL3DriverBase *this,int max_vertex_count)

{
  PFNGLBUFFERDATAPROC_MT p_Var1;
  size_type sVar2;
  long lVar3;
  unsigned_short *puVar4;
  int in_ESI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  int k;
  vector<unsigned_short,_std::allocator<unsigned_short>_> QuadsIndices;
  int max_quad_count;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffb0;
  int local_2c;
  pointer in_stack_ffffffffffffffd8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffe0;
  
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x35ca41);
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8);
  for (local_2c = 0; local_2c < in_ESI / 4; local_2c = local_2c + 1) {
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  (*GL.GenBuffers)(1,(GLuint *)
                     ((long)&in_RDI[0x79].
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4));
  (*GL.BindBuffer)(0x8892,*(GLuint *)
                           ((long)&in_RDI[0x79].
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4));
  p_Var1 = GL.BufferData;
  sVar2 = ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &stack0xffffffffffffffd8);
  lVar3 = sVar2 << 1;
  puVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x35cb9d);
  (*p_Var1)(0x8892,lVar3,puVar4,0x88e4);
  (*GL.BindBuffer)(0x8892,0);
  sVar2 = ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &stack0xffffffffffffffd8);
  *(int *)&in_RDI[0x79].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish = (int)sVar2;
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_RDI);
  return;
}

Assistant:

void COpenGL3DriverBase::initQuadsIndices(int max_vertex_count)
{
	int max_quad_count = max_vertex_count / 4;
	std::vector<GLushort> QuadsIndices;
	QuadsIndices.reserve(6 * max_quad_count);
	for (int k = 0; k < max_quad_count; k++) {
		QuadsIndices.push_back(4 * k + 0);
		QuadsIndices.push_back(4 * k + 1);
		QuadsIndices.push_back(4 * k + 2);
		QuadsIndices.push_back(4 * k + 0);
		QuadsIndices.push_back(4 * k + 2);
		QuadsIndices.push_back(4 * k + 3);
	}
	GL.GenBuffers(1, &QuadIndexBuffer);
	GL.BindBuffer(GL_ARRAY_BUFFER, QuadIndexBuffer);
	GL.BufferData(GL_ARRAY_BUFFER, sizeof(QuadsIndices[0]) * QuadsIndices.size(), QuadsIndices.data(), GL_STATIC_DRAW);
	GL.BindBuffer(GL_ARRAY_BUFFER, 0);
	QuadIndexCount = QuadsIndices.size();
}